

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O0

compile_errcode __thiscall ArgumentList::Parse(ArgumentList *this)

{
  LogTools *log_tools_ptr;
  bool bVar1;
  allocator local_49;
  string local_48;
  SymbolName local_24;
  undefined4 local_20;
  SymbolName name;
  int state;
  int ret;
  ArgumentList *this_local;
  
  name = WHILE_SYM;
  local_20 = 0;
  _state = this;
  do {
    local_24 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    switch(local_20) {
    case 0:
      if (local_24 == R_CIRCLE_BRACKET_SYM) {
        return 0;
      }
      bVar1 = IsValidVariableType(local_24);
      log_tools_ptr = g_log_tools;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_48,"expected a \')\' in argument list",&local_49);
        GrammaErrorLogs(log_tools_ptr,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        return -1;
      }
      local_20 = 1;
      break;
    case 1:
      if (local_24 != IDENTIFIER_SYM) {
        return -1;
      }
      local_20 = 2;
      break;
    case 2:
      if (local_24 != COMMA_SYM) {
        return 0;
      }
      local_20 = 3;
      break;
    case 3:
      bVar1 = IsValidVariableType(local_24);
      if (!bVar1) {
        return -1;
      }
      local_20 = 1;
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode ArgumentList::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')' in argument list");
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == COMMA_SYM) {
                    state = 3;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 3: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}